

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsSamplerObjectTest.cpp
# Opt level: O2

void deqp::gls::MultiTextureSamplerTest::setTextureState
               (Functions *gl,GLenum target,SamplingState state)

{
  GLenum GVar1;
  
  (*gl->texParameteri)(target,0x2801,state.minFilter);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"glTexParameteri(target, GL_TEXTURE_MIN_FILTER, state.minFilter)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x256);
  (*gl->texParameteri)(target,0x2800,state.magFilter);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"glTexParameteri(target, GL_TEXTURE_MAG_FILTER, state.magFilter)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,600);
  (*gl->texParameteri)(target,0x2802,state.wrapS);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"glTexParameteri(target, GL_TEXTURE_WRAP_S, state.wrapS)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x25a);
  (*gl->texParameteri)(target,0x2803,state.wrapT);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"glTexParameteri(target, GL_TEXTURE_WRAP_T, state.wrapT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x25c);
  (*gl->texParameteri)(target,0x8072,state.wrapR);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"glTexParameteri(target, GL_TEXTURE_WRAP_R, state.wrapR)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x25e);
  (*gl->texParameterf)(target,0x813b,state.maxLod);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"glTexParameterf(target, GL_TEXTURE_MAX_LOD, state.maxLod)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x260);
  (*gl->texParameterf)(target,0x813a,state.minLod);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"glTexParameterf(target, GL_TEXTURE_MIN_LOD, state.minLod)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x262);
  return;
}

Assistant:

void MultiTextureSamplerTest::setTextureState (const glw::Functions& gl, GLenum target, SamplingState state)
{
	gl.texParameteri(target, GL_TEXTURE_MIN_FILTER, state.minFilter);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri(target, GL_TEXTURE_MIN_FILTER, state.minFilter)");
	gl.texParameteri(target, GL_TEXTURE_MAG_FILTER, state.magFilter);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri(target, GL_TEXTURE_MAG_FILTER, state.magFilter)");
	gl.texParameteri(target, GL_TEXTURE_WRAP_S, state.wrapS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri(target, GL_TEXTURE_WRAP_S, state.wrapS)");
	gl.texParameteri(target, GL_TEXTURE_WRAP_T, state.wrapT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri(target, GL_TEXTURE_WRAP_T, state.wrapT)");
	gl.texParameteri(target, GL_TEXTURE_WRAP_R, state.wrapR);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri(target, GL_TEXTURE_WRAP_R, state.wrapR)");
	gl.texParameterf(target, GL_TEXTURE_MAX_LOD, state.maxLod);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameterf(target, GL_TEXTURE_MAX_LOD, state.maxLod)");
	gl.texParameterf(target, GL_TEXTURE_MIN_LOD, state.minLod);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameterf(target, GL_TEXTURE_MIN_LOD, state.minLod)");
}